

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

int Lib::List<Inferences::ALASCA::Demodulation::Rhs>::remove(char *__filename)

{
  bool bVar1;
  List<Inferences::ALASCA::Demodulation::Rhs> *pLVar2;
  List<Inferences::ALASCA::Demodulation::Rhs> *next;
  List<Inferences::ALASCA::Demodulation::Rhs> *current;
  List<Inferences::ALASCA::Demodulation::Rhs> *result;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  Rhs *in_stack_ffffffffffffffa8;
  Clause *in_stack_ffffffffffffffb0;
  List<Inferences::ALASCA::Demodulation::Rhs> *local_48;
  List<Inferences::ALASCA::Demodulation::Rhs> *local_40;
  Rhs local_30;
  List<Inferences::ALASCA::Demodulation::Rhs> *local_10;
  int local_8;
  
  local_10 = (List<Inferences::ALASCA::Demodulation::Rhs> *)__filename;
  bVar1 = isEmpty((List<Inferences::ALASCA::Demodulation::Rhs> *)__filename);
  if (bVar1) {
    pLVar2 = empty();
    local_8 = (int)pLVar2;
  }
  else {
    head(&local_30,local_10);
    bVar1 = Inferences::ALASCA::operator==
                      ((Rhs *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      pLVar2 = tail(local_10);
      local_8 = (int)pLVar2;
      if (local_10 != (List<Inferences::ALASCA::Demodulation::Rhs> *)0x0) {
        operator_delete(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    else {
      pLVar2 = tail(local_10);
      bVar1 = isEmpty(pLVar2);
      if (bVar1) {
        local_8 = (int)local_10;
      }
      else {
        local_40 = local_10;
        local_48 = tail(local_10);
        do {
          head((Rhs *)&stack0xffffffffffffff98,local_48);
          bVar1 = Inferences::ALASCA::operator==
                            ((Rhs *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          if (bVar1) {
            pLVar2 = tail(local_48);
            setTail(local_40,pLVar2);
            if (local_48 != (List<Inferences::ALASCA::Demodulation::Rhs> *)0x0) {
              operator_delete(local_48,(size_t)local_40);
            }
            local_8 = (int)local_10;
            return local_8;
          }
          local_40 = local_48;
          local_48 = tail(local_48);
          bVar1 = isEmpty(local_48);
        } while (!bVar1);
        local_8 = (int)local_10;
      }
    }
  }
  return local_8;
}

Assistant:

static List* remove (C elem, List* l)
  {
    if (isEmpty(l)) return empty();

    if (l->head() == elem) {
      List* result = l->tail();
      delete l;
      return result;
    }
    if (isEmpty(l->tail())) return l;

    List* current = l;
    List* next = l->tail();

    for (;;) {
      if (next->head() == elem) { // element found
        current->setTail(next->tail());
        delete next;
        return l;
      }
      current = next;
      next = next->tail();
      if (isEmpty(next)) return l;
    }
  }